

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_helpers.cpp
# Opt level: O3

vector<bool,_true> *
duckdb::ParseColumnList
          (vector<bool,_true> *__return_storage_ptr__,vector<duckdb::Value,_true> *set,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,string *loption)

{
  pointer pcVar1;
  const_reference this;
  mapped_type *pmVar2;
  reference __k;
  iterator iVar3;
  BinderException *pBVar4;
  size_type __n;
  size_type __n_00;
  _Hash_node_base *p_Var5;
  reference rVar6;
  case_insensitive_map_t<bool> option_map;
  string local_c8;
  undefined1 local_a8 [32];
  float local_88;
  size_t local_80;
  __node_base_ptr p_Stack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->super_vector<bool,_std::allocator<bool>_>).
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super_vector<bool,_std::allocator<bool>_>).
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super_vector<bool,_std::allocator<bool>_>).
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super_vector<bool,_std::allocator<bool>_>).
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super_vector<bool,_std::allocator<bool>_>).
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  if ((set->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (set->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar4 = (BinderException *)__cxa_allocate_exception(0x10);
    local_a8._0_8_ = local_a8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"\"%s\" expects a column list or * as parameter","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar1 = (loption->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + loption->_M_string_length);
    BinderException::BinderException<std::__cxx11::string>(pBVar4,(string *)local_a8,&local_50);
    __cxa_throw(pBVar4,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_a8._0_8_ = &p_Stack_78;
  local_a8._8_8_ = 1;
  local_a8._16_8_ = (_Hash_node_base *)0x0;
  local_a8._24_8_ = 0;
  local_88 = 1.0;
  local_80 = 0;
  p_Stack_78 = (__node_base_ptr)0x0;
  __n_00 = 0;
  do {
    this = vector<duckdb::Value,_true>::operator[](set,__n_00);
    Value::ToString_abi_cxx11_(&local_c8,this);
    pmVar2 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)local_a8,&local_c8);
    *pmVar2 = false;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    __n_00 = __n_00 + 1;
  } while (__n_00 < (ulong)((long)(set->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
                                  .super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(set->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
                                  .super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 6));
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)__return_storage_ptr__,
             (long)(names->
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(names->
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,false);
  p_Var5 = (_Hash_node_base *)local_a8._16_8_;
  if ((names->
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (names->
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      __k = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::operator[](names,__n);
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)local_a8,__k);
      if (iVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
          ._M_cur != (__node_type *)0x0) {
        rVar6 = vector<bool,_true>::get<true>(__return_storage_ptr__,__n);
        *rVar6._M_p = *rVar6._M_p | rVar6._M_mask;
        *(undefined1 *)
         ((long)iVar3.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                ._M_cur + 0x28) = 1;
      }
      __n = __n + 1;
      p_Var5 = (_Hash_node_base *)local_a8._16_8_;
    } while (__n < (ulong)((long)(names->
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(names->
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  while( true ) {
    if (p_Var5 == (_Hash_node_base *)0x0) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_a8);
      return __return_storage_ptr__;
    }
    if (*(char *)&p_Var5[5]._M_nxt == '\0') break;
    p_Var5 = p_Var5->_M_nxt;
  }
  pBVar4 = (BinderException *)__cxa_allocate_exception(0x10);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"\"%s\" expected to find %s, but it was not found in the table","")
  ;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (loption->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + loption->_M_string_length);
  BinderException::BinderException<std::__cxx11::string,char_const*>
            (pBVar4,&local_c8,&local_70,(char *)p_Var5[1]._M_nxt);
  __cxa_throw(pBVar4,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

vector<bool> ParseColumnList(const vector<Value> &set, vector<string> &names, const string &loption) {
	vector<bool> result;

	if (set.empty()) {
		throw BinderException("\"%s\" expects a column list or * as parameter", loption);
	}
	// list of options: parse the list
	case_insensitive_map_t<bool> option_map;
	for (idx_t i = 0; i < set.size(); i++) {
		option_map[set[i].ToString()] = false;
	}
	result.resize(names.size(), false);
	for (idx_t i = 0; i < names.size(); i++) {
		auto entry = option_map.find(names[i]);
		if (entry != option_map.end()) {
			result[i] = true;
			entry->second = true;
		}
	}
	for (auto &entry : option_map) {
		if (!entry.second) {
			throw BinderException("\"%s\" expected to find %s, but it was not found in the table", loption,
			                      entry.first.c_str());
		}
	}
	return result;
}